

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglQueryConfigTests.cpp
# Opt level: O2

IterateResult __thiscall deqp::egl::GetConfigAttribCase::iterate(GetConfigAttribCase *this)

{
  ostringstream *poVar1;
  TestLog *pTVar2;
  EGLConfig config;
  deUint32 err;
  IterateResult IVar3;
  void **ppvVar4;
  EGLint id;
  int local_1a4;
  undefined1 local_1a0 [384];
  
  ppvVar4 = (this->m_configsIter)._M_current;
  pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_1a0._0_8_ = pTVar2;
  if (ppvVar4 ==
      (this->m_configs).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    poVar1 = (ostringstream *)(local_1a0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"No configs available.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    IVar3 = STOP;
  }
  else {
    config = *ppvVar4;
    eglu::CallLogWrapper::eglGetConfigAttrib
              (&this->super_CallLogWrapper,this->m_display,config,0x3028,&local_1a4);
    err = eglu::CallLogWrapper::eglGetError(&this->super_CallLogWrapper);
    eglu::checkError(err,(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglQueryConfigTests.cpp"
                     ,0xfd);
    poVar1 = (ostringstream *)(local_1a0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Config ID ");
    std::ostream::operator<<(poVar1,local_1a4);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(this,config);
    local_1a0._0_8_ = pTVar2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1a0 + 8));
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1a0 + 8));
    ppvVar4 = (this->m_configsIter)._M_current + 1;
    (this->m_configsIter)._M_current = ppvVar4;
    IVar3 = (IterateResult)
            (ppvVar4 !=
            (this->m_configs).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_finish);
  }
  return IVar3;
}

Assistant:

tcu::TestNode::IterateResult GetConfigAttribCase::iterate (void)
{
	tcu::TestLog&	log		= m_testCtx.getLog();

	if (m_configsIter == m_configs.end())
	{
		log << TestLog::Message << "No configs available." << TestLog::EndMessage;
		return STOP;
	}

	{
		const EGLConfig	config	= *m_configsIter;
		EGLint			id;

		eglGetConfigAttrib(m_display, config, EGL_CONFIG_ID, &id);
		eglu::checkError(eglGetError(), DE_NULL, __FILE__, __LINE__);
		log << TestLog::Message << "Config ID " << id << TestLog::EndMessage;

		executeTest(config);
	}

	log << TestLog::Message << TestLog::EndMessage;

	m_configsIter++;

	if (m_configsIter == m_configs.end())
		return STOP;
	else
		return CONTINUE;
}